

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_PluginReceivesJsonName_Test::
~CommandLineInterfaceTest_PluginReceivesJsonName_Test
          (CommandLineInterfaceTest_PluginReceivesJsonName_Test *this)

{
  CommandLineInterfaceTest_PluginReceivesJsonName_Test *this_local;
  
  ~CommandLineInterfaceTest_PluginReceivesJsonName_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PluginReceivesJsonName) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message MockCodeGenerator_HasJsonName {\n"
                 "  optional int32 value = 1;\n"
                 "}\n");

  Run("protocol_compiler --plug_out=$tmpdir --proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring("Saw json_name: true");
}